

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

MppBufferGroupImpl * __thiscall
MppBufferService::get_group
          (MppBufferService *this,char *tag,char *caller,MppBufferMode mode,MppBufferType type,
          RK_U32 is_misc)

{
  list_head *plVar1;
  list_head *plVar2;
  hlist_node *phVar3;
  RK_U32 RVar4;
  MppBufferGroupImpl *group;
  pthread_mutex_t *ppVar5;
  hlist_head *phVar6;
  char *pcVar7;
  MppBufferType MVar8;
  ulong uVar9;
  MppAllocFlagType MVar10;
  pthread_mutexattr_t attr;
  MppAllocatorApi *local_60;
  MppAllocator local_58;
  RK_U32 local_4c;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  uVar9 = (ulong)type & 0xffff;
  local_38 = tag;
  mpp_env_get_u32("mpp_buffer_debug",&mpp_buffer_debug,mpp_buffer_debug);
  MVar8 = (MppBufferType)uVar9;
  if ((int)mode < 2 && MVar8 < MPP_BUFFER_TYPE_BUTT) {
    local_40 = caller;
    group = (MppBufferGroupImpl *)mpp_mem_pool_get_f(caller,mpp_buf_grp_pool);
    if (group == (MppBufferGroupImpl *)0x0) {
      _mpp_log_l(2,"mpp_buffer","MppBufferService failed to allocate group context\n",(char *)0x0);
      return (MppBufferGroupImpl *)0x0;
    }
    MVar10 = type >> 0xe & MPP_ALLOC_FLAG_CMA |
             type >> 0x10 & MPP_ALLOC_FLAG_CACHABLE | type >> 0x15 & MPP_ALLOC_FLAG_DMA32;
    group->flags = MVar10;
    local_4c = is_misc;
    ppVar5 = (pthread_mutex_t *)get_lock();
    if (ppVar5 != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(ppVar5);
    }
    local_58 = *(MppAllocator *)
                ((long)this->mAllocator[0] + (ulong)MVar10 * 8 + (ulong)(MVar8 << 6));
    local_60 = this->mAllocatorApi[uVar9];
    local_48 = uVar9;
    if (local_58 == (MppAllocator)0x0) {
      mpp_allocator_get(&local_58,&local_60,type,group->flags);
      *(MppAllocator *)((long)this->mAllocator[0] + (ulong)MVar10 * 8 + (ulong)(MVar8 << 6)) =
           local_58;
      this->mAllocatorApi[local_48] = local_60;
    }
    group->allocator = local_58;
    group->alloc_api = local_60;
    MVar10 = mpp_allocator_get_flags(local_58);
    group->flags = MVar10;
    if (ppVar5 != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(ppVar5);
    }
    pcVar7 = local_40;
    if ((group->allocator != (MppAllocator)0x0) && (group->alloc_api != (MppAllocatorApi *)0x0)) {
      plVar1 = &group->list_group;
      (group->list_group).next = plVar1;
      (group->list_group).prev = plVar1;
      (group->list_used).next = &group->list_used;
      (group->list_used).prev = &group->list_used;
      (group->list_unused).next = &group->list_unused;
      (group->list_unused).prev = &group->list_unused;
      (group->hlist).next = (hlist_node *)0x0;
      (group->hlist).pprev = (hlist_node **)0x0;
      RVar4 = mpp_buffer_debug;
      group->log_runtime_en = mpp_buffer_debug >> 1 & 1;
      group->log_history_en = RVar4 >> 2 & 1;
      group->caller = local_40;
      group->mode = mode;
      group->type = MVar8;
      group->limit = 0x5000000;
      group->clear_on_exit = RVar4 >> 4 & 1;
      group->dump_on_exit = RVar4 >> 5 & 1;
      pthread_mutexattr_init((pthread_mutexattr_t *)&local_60);
      pthread_mutexattr_settype((pthread_mutexattr_t *)&local_60,1);
      pthread_mutex_init((pthread_mutex_t *)&group->buf_lock,(pthread_mutexattr_t *)&local_60);
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_60);
      if (group->log_history_en != 0) {
        ppVar5 = (pthread_mutex_t *)mpp_osal_malloc("buf_logs_init",0x6038);
        if (ppVar5 == (pthread_mutex_t *)0x0) {
          _mpp_log_l(2,"mpp_buffer","failed to create %d buf logs\n","buf_logs_init",0x400);
        }
        else {
          pthread_mutexattr_init((pthread_mutexattr_t *)&local_58);
          pthread_mutexattr_settype((pthread_mutexattr_t *)&local_58,1);
          pthread_mutex_init(ppVar5,(pthread_mutexattr_t *)&local_58);
          pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_58);
          ppVar5[1].__align = 0x400;
          *(long *)((long)ppVar5 + 0x30) = (long)ppVar5 + 0x38;
        }
        group->logs = (MppBufLogs *)ppVar5;
      }
      ppVar5 = (pthread_mutex_t *)get_lock();
      if (ppVar5 != (pthread_mutex_t *)0x0) {
        pthread_mutex_lock(ppVar5);
      }
      RVar4 = get_group_id(this);
      if (local_38 == (char *)0x0) {
        builtin_strncpy(group->tag,"unknown",8);
      }
      else {
        snprintf((char *)group,0x1f,"%s_%d",local_38,(ulong)RVar4);
      }
      group->group_id = RVar4;
      plVar2 = (this->mListGroup).prev;
      (this->mListGroup).prev = plVar1;
      (group->list_group).next = &this->mListGroup;
      (group->list_group).prev = plVar2;
      plVar2->next = plVar1;
      phVar6 = this->mHashGroup + (RVar4 * 0x61c88647 >> 0x18);
      phVar3 = phVar6->first;
      (group->hlist).next = phVar3;
      if (phVar3 != (hlist_node *)0x0) {
        phVar3->pprev = &(group->hlist).next;
      }
      phVar6->first = &group->hlist;
      (group->hlist).pprev = &phVar6->first;
      buf_grp_add_log(group,GRP_CREATE,pcVar7);
      if (local_4c != 0) {
        this->misc[mode][local_48] = RVar4;
        group->is_misc = 1;
        this->misc_count = this->misc_count + 1;
      }
      if (ppVar5 == (pthread_mutex_t *)0x0) {
        return group;
      }
      pthread_mutex_unlock(ppVar5);
      return group;
    }
    mpp_mem_pool_put_f(local_40,mpp_buf_grp_pool,group);
    pcVar7 = "MppBufferService get_group failed to get allocater with mode %d type %x\n";
  }
  else {
    pcVar7 = "MppBufferService get_group found invalid mode %d type %x\n";
  }
  _mpp_log_l(2,"mpp_buffer",pcVar7,(char *)0x0,(ulong)mode,(ulong)type);
  return (MppBufferGroupImpl *)0x0;
}

Assistant:

MppBufferGroupImpl *MppBufferService::get_group(const char *tag, const char *caller,
                                                MppBufferMode mode, MppBufferType type,
                                                RK_U32 is_misc)
{
    MppBufferType buffer_type = (MppBufferType)(type & MPP_BUFFER_TYPE_MASK);
    MppBufferGroupImpl *p = NULL;
    RK_U32 flag = MPP_ALLOC_FLAG_NONE;

    /* env update */
    mpp_env_get_u32("mpp_buffer_debug", &mpp_buffer_debug, mpp_buffer_debug);

    if (mode >= MPP_BUFFER_MODE_BUTT || buffer_type >= MPP_BUFFER_TYPE_BUTT) {
        mpp_err("MppBufferService get_group found invalid mode %d type %x\n", mode, type);
        return NULL;
    }

    p = (MppBufferGroupImpl *)mpp_mem_pool_get_f(caller, mpp_buf_grp_pool);
    if (!p) {
        mpp_err("MppBufferService failed to allocate group context\n");
        return NULL;
    }

    if (type & MPP_BUFFER_FLAGS_DMA32)
        flag += MPP_ALLOC_FLAG_DMA32;

    if (type & MPP_BUFFER_FLAGS_CACHABLE)
        flag += MPP_ALLOC_FLAG_CACHABLE;

    if (type & MPP_BUFFER_FLAGS_CONTIG)
        flag += MPP_ALLOC_FLAG_CMA;

    p->flags = (MppAllocFlagType)flag;

    {
        AutoMutex auto_lock(get_lock());
        MppAllocator allocator = NULL;
        MppAllocatorApi *alloc_api = NULL;

        allocator = mAllocator[buffer_type][flag];
        alloc_api = mAllocatorApi[buffer_type];

        // allocate general buffer first
        if (!allocator) {
            mpp_allocator_get(&allocator, &alloc_api, type, p->flags);
            mAllocator[buffer_type][flag] = allocator;
            mAllocatorApi[buffer_type] = alloc_api;
        }

        p->allocator = allocator;
        p->alloc_api = alloc_api;
        p->flags = mpp_allocator_get_flags(allocator);
    }

    if (!p->allocator || !p->alloc_api) {
        mpp_mem_pool_put_f(caller, mpp_buf_grp_pool, p);
        mpp_err("MppBufferService get_group failed to get allocater with mode %d type %x\n", mode, type);
        return NULL;
    }

    INIT_LIST_HEAD(&p->list_group);
    INIT_LIST_HEAD(&p->list_used);
    INIT_LIST_HEAD(&p->list_unused);
    INIT_HLIST_NODE(&p->hlist);

    p->log_runtime_en   = (mpp_buffer_debug & MPP_BUF_DBG_OPS_RUNTIME) ? (1) : (0);
    p->log_history_en   = (mpp_buffer_debug & MPP_BUF_DBG_OPS_HISTORY) ? (1) : (0);

    p->caller   = caller;
    p->mode     = mode;
    p->type     = buffer_type;
    p->limit    = BUFFER_GROUP_SIZE_DEFAULT;
    p->clear_on_exit = (mpp_buffer_debug & MPP_BUF_DBG_CLR_ON_EXIT) ? (1) : (0);
    p->dump_on_exit  = (mpp_buffer_debug & MPP_BUF_DBG_DUMP_ON_EXIT) ? (1) : (0);

    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&p->buf_lock, &attr);
    pthread_mutexattr_destroy(&attr);

    if (p->log_history_en)
        p->logs = buf_logs_init(BUFFER_OPS_MAX_COUNT);

    AutoMutex auto_lock(get_lock());
    RK_U32 id = get_group_id();

    if (tag) {
        snprintf(p->tag, sizeof(p->tag) - 1, "%s_%d", tag, id);
    } else {
        snprintf(p->tag, sizeof(p->tag) - 1, "unknown");
    }
    p->group_id = id;

    list_add_tail(&p->list_group, &mListGroup);
    hash_add(mHashGroup, &p->hlist, id);

    buf_grp_add_log(p, GRP_CREATE, caller);

    if (is_misc) {
        misc[mode][buffer_type] = id;
        p->is_misc = 1;
        misc_count++;
    }

    return p;
}